

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::PipelineOp>::~ArrayBuilder(ArrayBuilder<capnp::PipelineOp> *this)

{
  PipelineOp *pPVar1;
  RemoveConst<capnp::PipelineOp> *pRVar2;
  PipelineOp *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (PipelineOp *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->ptr = (PipelineOp *)0x0;
    this->pos = (RemoveConst<capnp::PipelineOp> *)0x0;
    this->endPtr = (PipelineOp *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pPVar1,8,(long)pRVar2 - (long)pPVar1 >> 3,
               (long)pPVar3 - (long)pPVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }